

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void build_rr(m68k_info *info,int opcode,uint8_t size,int imm)

{
  cs_m68k *pcVar1;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar2;
  undefined7 in_register_00000011;
  
  pcVar1 = build_init_op(info,opcode,2,(int)CONCAT71(in_register_00000011,size));
  pcVar1->operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar1->operands[0].field_0.reg = (info->ir & 7) + M68K_REG_D0;
  pcVar1->operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  pcVar1->operands[1].field_0.reg = (info->ir >> 9 & 7) + M68K_REG_D0;
  if (0 < imm) {
    pcVar1->op_count = '\x03';
    pcVar1->operands[2].type = M68K_OP_IMM;
    pcVar1->operands[2].address_mode = M68K_AM_IMMEDIATE;
    aVar2.reg_pair.reg_1 = 0;
    aVar2.reg = imm;
    pcVar1->operands[2].field_0 = aVar2;
  }
  return;
}

Assistant:

static void build_rr(m68k_info *info, int opcode, uint8_t size, int imm)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k_op* op2;
	cs_m68k* ext = build_init_op(info, opcode, 2, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];
	op2 = &ext->operands[2];

	op0->address_mode = M68K_AM_REG_DIRECT_DATA;
	op0->reg = M68K_REG_D0 + (info->ir & 7);

	op1->address_mode = M68K_AM_REG_DIRECT_DATA;
	op1->reg = M68K_REG_D0 + ((info->ir >> 9) & 7);

	if (imm > 0) {
		ext->op_count = 3;
		op2->type = M68K_OP_IMM;
		op2->address_mode = M68K_AM_IMMEDIATE;
		op2->imm = imm;
	}
}